

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eodata.hpp
# Opt level: O2

void __thiscall ESF::ESF(ESF *this,string *filename,bool auto_split)

{
  allocator<char> local_41;
  string local_40;
  
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->files).super__Vector_base<Pub_File,_std::allocator<Pub_File>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data).super__Vector_base<ESF_Data_Base<ESF>,_std::allocator<ESF_Data_Base<ESF>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(filename->_M_dataplus)._M_p,&local_41);
  Read(this,&local_40,auto_split);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

ESF(const std::string& filename, bool auto_split) { Read(filename.c_str(), auto_split); }